

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O1

void __thiscall mocker::SSADestruction::sequentializeParallelCopies(SSADestruction *this)

{
  BasicBlock *this_00;
  _Sp_alloc_shared_tag<std::allocator<mocker::ir::Load>_> __a;
  FunctionModule *pFVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar2;
  undefined8 uVar3;
  _List_node_base *p_Var4;
  mapped_type *pmVar5;
  iterator iVar6;
  _List_node_base *p_Var7;
  shared_ptr<mocker::ir::Addr> newVal;
  shared_ptr<mocker::ir::Reg> p;
  mapped_type addr;
  shared_ptr<mocker::ir::Reg> oldVal;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
  regHoldingOldValue;
  undefined1 local_108 [40];
  pointer local_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  shared_ptr<mocker::ir::Reg> local_b0;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_a0;
  _List_node_base *local_98;
  __node_base local_90;
  shared_ptr<mocker::ir::IRInst> local_88;
  shared_ptr<mocker::ir::IRInst> local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  pFVar1 = (this->super_FuncPass).func;
  local_d0.field_2._M_allocated_capacity =
       (size_type)
       (pFVar1->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  local_98 = (_List_node_base *)&pFVar1->bbs;
  if ((_List_node_base *)local_d0.field_2._M_allocated_capacity != local_98) {
    local_a0 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->parallelCopies;
    local_90._M_nxt = (_Hash_node_base *)&this->addresses;
    __a._M_a = (allocator<mocker::ir::Load> *)(local_108 + 0x18);
    local_d0.field_2._8_8_ = this;
    do {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_e0 = (pointer)((_List_node_base *)(local_d0.field_2._M_allocated_capacity + 0x10))->
                          _M_next;
      p_Var4 = (_List_node_base *)
               std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_a0,(key_type *)&local_e0);
      p_Var7 = p_Var4->_M_next;
      if (p_Var7 != p_Var4) {
        this_00 = (BasicBlock *)(local_d0.field_2._M_allocated_capacity + 0x10);
        do {
          pFVar1 = *(FunctionModule **)(local_d0.field_2._8_8_ + 8);
          local_e0 = &local_d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
          ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_108,&pFVar1->identifier);
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_68,(key_type *)&(p_Var7[1]._M_next)->_M_prev);
          uVar3 = local_108._8_8_;
          uVar2 = local_108._0_8_;
          local_108._0_8_ = (pointer)0x0;
          local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_01 = (pmVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          (pmVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)uVar2;
          (pmVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pmVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (pmVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
          if (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,(ulong)(local_d0._M_dataplus._M_p + 1));
          }
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_90._M_nxt,(key_type *)&(p_Var7[1]._M_next)->_M_prev);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          local_e0 = *(pointer *)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                             ._M_cur + 0x28);
          local_d8 = *(pointer *)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                             ._M_cur + 0x30);
          if (local_d8 != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&local_d8->_M_string_length = (int)local_d8->_M_string_length + 1;
              UNLOCK();
            }
            else {
              *(int *)&local_d8->_M_string_length = (int)local_d8->_M_string_length + 1;
            }
          }
          local_108._0_8_ = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                     (Load **)local_108,__a,&local_b0,(shared_ptr<mocker::ir::Reg> *)&local_e0);
          local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_108._0_8_;
          local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
          local_108._0_8_ = (pointer)0x0;
          local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ir::BasicBlock::appendInstBeforeTerminator(this_00,&local_78);
          if (local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          local_108._0_8_ = p_Var7[2]._M_next;
          local_108._8_8_ = p_Var7[2]._M_prev;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_)->_M_use_count +
                   1;
            }
          }
          ir::dycLocalReg((ir *)__a._M_a,(shared_ptr<mocker::ir::Addr> *)(p_Var7 + 2));
          if (local_108._24_8_ != 0) {
            iVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&local_68,(key_type *)(local_108._24_8_ + 8));
            if (iVar6.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              local_108._0_8_ =
                   *(undefined8 *)
                    ((long)iVar6.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                           ._M_cur + 0x28);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)iVar6.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                                ._M_cur + 0x30));
            }
          }
          if ((pointer)local_108._32_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._32_8_);
          }
          local_108._24_8_ = 0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 0x20),
                     (Store **)__a._M_a,(allocator<mocker::ir::Store> *)(local_108 + 0x17),
                     (shared_ptr<mocker::ir::Reg> *)&local_e0,
                     (shared_ptr<mocker::ir::Addr> *)local_108);
          local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_108._24_8_;
          local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._32_8_;
          local_108._24_8_ = 0;
          local_108._32_8_ = (pointer)0x0;
          ir::BasicBlock::appendInstBeforeTerminator(this_00,&local_88);
          if ((pointer)local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((pointer)local_108._32_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._32_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          if (local_d8 != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8);
          }
          if (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var7 = (((_List_base<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>
                      *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        } while (p_Var7 != p_Var4);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      local_d0.field_2._M_allocated_capacity = *local_d0.field_2._M_allocated_capacity;
    } while ((_List_node_base *)local_d0.field_2._M_allocated_capacity != local_98);
  }
  return;
}

Assistant:

void SSADestruction::sequentializeParallelCopies() {
  // We adopt a naive approach here: we first load the old values to temporary
  // registers and rename the later use. Then, for each Copy, we simply put a
  // Store.
  // Redundant Loads can be eliminate in later passes.

  for (auto &bb : func.getMutableBBs()) {
    std::unordered_map<std::string, std::shared_ptr<ir::Reg>>
        regHoldingOldValue;
    const auto &pcopies = parallelCopies[bb.getLabelID()];
    for (auto &pcopy : pcopies) {
      auto oldVal = regHoldingOldValue[pcopy.dest->getIdentifier()] =
          func.makeTempLocalReg();
      auto addr = addresses.at(pcopy.dest->getIdentifier());
      bb.appendInstBeforeTerminator(std::make_shared<ir::Load>(oldVal, addr));
      std::shared_ptr<ir::Addr> newVal = pcopy.val;
      if (auto p = ir::dycLocalReg(pcopy.val)) {
        auto iter = regHoldingOldValue.find(p->getIdentifier());
        if (iter != regHoldingOldValue.end())
          newVal = iter->second;
      }
      bb.appendInstBeforeTerminator(std::make_shared<ir::Store>(addr, newVal));
    }
  }
}